

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpacktable_p.h
# Opt level: O0

void __thiscall HPack::HeaderField::~HeaderField(HeaderField *this)

{
  QByteArray::~QByteArray((QByteArray *)0x292fb0);
  QByteArray::~QByteArray((QByteArray *)0x292fba);
  return;
}

Assistant:

struct Q_AUTOTEST_EXPORT HeaderField
{
    HeaderField()
    {
    }

    HeaderField(const QByteArray &n, const QByteArray &v)
        : name(n),
          value(v)
    {
    }

    bool operator == (const HeaderField &rhs) const
    {
        return name == rhs.name && value == rhs.value;
    }

    QByteArray name;
    QByteArray value;
}